

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

CodeLocation __thiscall
soul::SimpleTokeniser::findEndOfMatchingDelimiter
          (SimpleTokeniser *this,CodeLocation *start,TokenType openDelim,TokenType closeDelim)

{
  bool bVar1;
  int iVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar3;
  CodeLocation CVar4;
  SimpleTokeniser tokeniser;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  local_90;
  
  SimpleTokeniser((SimpleTokeniser *)&local_90,start,true);
  if (local_90.currentType.text != openDelim.text) {
    if ((openDelim.text != (char *)0x0) && (local_90.currentType.text != (char *)0x0)) {
      iVar2 = strcmp(local_90.currentType.text,openDelim.text);
      if (iVar2 == 0) goto LAB_001e15e0;
    }
    throwInternalCompilerError("tokeniser.matches (openDelim)","findEndOfMatchingDelimiter",0x54);
  }
LAB_001e15e0:
  bVar1 = skipPastMatchingCloseDelimiter((SimpleTokeniser *)&local_90,openDelim,closeDelim);
  if (bVar1) {
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)local_90.location.sourceCode.object;
    if (local_90.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_90.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_90.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    (this->super_SOULTokeniser).startLocation.sourceCode.object =
         (SourceCodeText *)local_90.location.location.data;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::~Tokeniser(&local_90);
    UVar3.data = extraout_RDX;
  }
  else {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::~Tokeniser(&local_90);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
    (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
    UVar3.data = extraout_RDX_00;
  }
  CVar4.location.data = UVar3.data;
  CVar4.sourceCode.object = (SourceCodeText *)this;
  return CVar4;
}

Assistant:

static CodeLocation findEndOfMatchingDelimiter (const CodeLocation& start, TokenType openDelim, TokenType closeDelim)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);
            SOUL_ASSERT (tokeniser.matches (openDelim));

            if (tokeniser.skipPastMatchingCloseDelimiter (openDelim, closeDelim))
                return tokeniser.location;
        }
        catch (const AbortCompilationException&) {}

        return {};
    }